

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
     ::
     lf_heterogeneous_queue_basic_void_tests<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>>
               (void)

{
  bool bVar1;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue_1;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue;
  int local_1c4;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_1c0;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_100;
  
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_100);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_100);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x5b);
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_100);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::lf_heter_queue(&local_1c0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::clear(&local_1c0);
  local_1c4 = 1;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::push<int>(&local_1c0,&local_1c4);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_1c0);
  if (bVar1) {
    detail::assert_failed<>
              ("!queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,99);
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::clear(&local_1c0);
  bVar1 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty(&local_1c0);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0x66);
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::clear(&local_1c0);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_1c0);
  return;
}

Assistant:

static void lf_heterogeneous_queue_basic_void_tests()
        {
            {
                QUEUE queue;
                DENSITY_TEST_ASSERT(queue.empty());
            }

            {
                QUEUE queue;
                queue.clear();

                queue.push(1);
                DENSITY_TEST_ASSERT(!queue.empty());

                queue.clear();
                DENSITY_TEST_ASSERT(queue.empty());
                queue.clear();
            }
        }